

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_info.hpp
# Opt level: O0

void __thiscall
mp::FlatModelInfoImpl::AddNumberOfConstraints
          (FlatModelInfoImpl *this,type_info *ti,char *name,int igroup,bool is_logical,int nc)

{
  int iVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  allocator<char> *in_RDX;
  byte in_R8B;
  int in_R9D;
  mapped_type *ci;
  type_info *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  allocator<char> *__a;
  key_type *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined1 local_59 [53];
  int local_24;
  byte local_1d;
  allocator<char> *local_18;
  
  local_1d = in_R8B & 1;
  local_24 = in_R9D;
  local_18 = in_RDX;
  pmVar2 = std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)CONCAT44(in_R9D,in_stack_ffffffffffffff50),
                        (key_type *)in_stack_ffffffffffffff48);
  iVar1 = local_24;
  *pmVar2 = *pmVar2 + in_R9D;
  std::reference_wrapper<std::type_info_const>::
  reference_wrapper<std::type_info_const&,void,std::type_info_const*>
            ((reference_wrapper<const_std::type_info> *)CONCAT44(in_R9D,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  pmVar3 = std::
           unordered_map<std::reference_wrapper<const_std::type_info>,_int,_mp::FlatModelInfoImpl::TypeInfoRefHasher,_mp::FlatModelInfoImpl::TypeInfoRefEqualTo,_std::allocator<std::pair<const_std::reference_wrapper<const_std::type_info>,_int>_>_>
           ::operator[]((unordered_map<std::reference_wrapper<const_std::type_info>,_int,_mp::FlatModelInfoImpl::TypeInfoRefHasher,_mp::FlatModelInfoImpl::TypeInfoRefEqualTo,_std::allocator<std::pair<const_std::reference_wrapper<const_std::type_info>,_int>_>_>
                         *)CONCAT44(in_R9D,in_stack_ffffffffffffff50),
                        (key_type *)in_stack_ffffffffffffff48);
  *pmVar3 = *pmVar3 + iVar1;
  __k = (key_type *)local_59;
  __a = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff90,(char *)__k,__a);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>_>
                         *)in_stack_ffffffffffffff90,__k);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  pmVar4->name_ = (char *)local_18;
  pmVar4->is_logical_ = (bool)(local_1d & 1);
  pmVar4->n_ = local_24;
  return;
}

Assistant:

void AddNumberOfConstraints(
      const std::type_info& ti, const char* name,
      int igroup, bool is_logical, int nc) override {
    cg_map_[igroup] += nc;
    ti_map_[ti] += nc;
    auto& ci = coninfo_map_[name];
    ci.name_ = name;
    ci.is_logical_ = is_logical;
    ci.n_ = nc;
  }